

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_list_uniq_equal(void *val1_p,void *val2_p,int UNUSED_mod,void *cb_data)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  lys_module *module;
  int action;
  int r;
  int j;
  int i;
  uint16_t idx_uniq;
  char *uniq_str;
  char *path2;
  char *path1;
  char *val2;
  char *val1;
  lyd_node *second;
  lyd_node *first;
  lyd_node *diter;
  lys_node_list *slist;
  ly_ctx *ctx;
  void *cb_data_local;
  void *pvStack_20;
  int UNUSED_mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  ctx = (ly_ctx *)cb_data;
  cb_data_local._4_4_ = UNUSED_mod;
  pvStack_20 = val2_p;
  val2_p_local = val1_p;
  if ((val1_p == (void *)0x0) || (val2_p == (void *)0x0)) {
    __assert_fail("val1_p && val2_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x96,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  second = *val1_p;
  val1 = *val2_p;
  iVar2 = (int)cb_data;
  if ((second == (lyd_node *)0x0) || (second->schema->nodetype != LYS_LIST)) {
    __assert_fail("first && (first->schema->nodetype == LYS_LIST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x9c,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  if (((long *)val1 == (long *)0x0) || (*(lys_node **)val1 != second->schema)) {
    __assert_fail("second && (second->schema == first->schema)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x9d,"int lyv_list_uniq_equal(void *, void *, int, void *)");
  }
  slist = (lys_node_list *)second->schema->module->ctx;
  diter = (lyd_node *)second->schema;
  if ((0 < iVar2) && (r = iVar2 + -1, r < (int)(uint)((lys_node *)diter)->padding[3]))
  goto LAB_0012abb7;
  r = 0;
  do {
    if ((int)(uint)*(byte *)((long)&diter->next + 7) <= r) {
      return 0;
    }
LAB_0012abb7:
    for (action = 0; action < (int)(uint)(diter[2].schema)->padding[(long)r * 0x10 + -0x14];
        action = action + 1) {
      first = resolve_data_descendant_schema_nodeid
                        (*(char **)(*(long *)((diter[2].schema)->padding + (long)r * 0x10 + -0x1c) +
                                   (long)action * 8),second->child);
      if (first == (lyd_node *)0x0) {
        iVar1 = lyd_get_unique_default
                          (*(char **)(*(long *)((diter[2].schema)->padding + (long)r * 0x10 + -0x1c)
                                     + (long)action * 8),second,&val2);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        val2 = (char *)first->ht;
      }
      first = resolve_data_descendant_schema_nodeid
                        (*(char **)(*(long *)((diter[2].schema)->padding + (long)r * 0x10 + -0x1c) +
                                   (long)action * 8),*(lyd_node **)(val1 + 0x40));
      if (first == (lyd_node *)0x0) {
        iVar1 = lyd_get_unique_default
                          (*(char **)(*(long *)((diter[2].schema)->padding + (long)r * 0x10 + -0x1c)
                                     + (long)action * 8),(lyd_node *)val1,&path1);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        path1 = (char *)first->ht;
      }
      if (((val2 == (char *)0x0) || (path1 == (char *)0x0)) || (val2 != path1)) break;
    }
    if ((action != 0) && (action == (uint)(diter[2].schema)->padding[(long)r * 0x10 + -0x14])) {
      ly_vlog_build_path(LY_VLOG_LYD,second,&path2,0,0);
      ly_vlog_build_path(LY_VLOG_LYD,val1,&uniq_str,0,0);
      __ptr = malloc(0x400);
      j._2_2_ = 0;
      action = 0;
      break;
    }
    if (0 < iVar2) {
      return 0;
    }
    r = r + 1;
  } while( true );
LAB_0012adb8:
  if ((int)(uint)(diter[2].schema)->padding[(long)r * 0x10 + -0x14] <= action) {
    ly_vlog((ly_ctx *)slist,LYE_NOUNIQ,LY_VLOG_LYD,val1,__ptr,path2,uniq_str);
LAB_0012aea5:
    free(path2);
    free(uniq_str);
    free(__ptr);
    return 1;
  }
  if (action != 0) {
    *(undefined1 *)((long)__ptr + (ulong)j._2_2_) = 0x20;
    j._2_2_ = j._2_2_ + 1;
  }
  module = lys_node_module((lys_node *)diter);
  iVar2 = lyd_build_relative_data_path
                    (module,second,
                     *(char **)(*(long *)((diter[2].schema)->padding + (long)r * 0x10 + -0x1c) +
                               (long)action * 8),(char *)((long)__ptr + (ulong)j._2_2_));
  if (iVar2 == -1) goto LAB_0012aea5;
  j._2_2_ = j._2_2_ + (short)iVar2;
  action = action + 1;
  goto LAB_0012adb8;
}

Assistant:

static int
lyv_list_uniq_equal(void *val1_p, void *val2_p, int UNUSED(mod), void *cb_data)
{
    struct ly_ctx *ctx;
    struct lys_node_list *slist;
    struct lyd_node *diter, *first, *second;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str;
    uint16_t idx_uniq;
    int i, j, r, action;

    assert(val1_p && val2_p);

    first = *((struct lyd_node **)val1_p);
    second = *((struct lyd_node **)val2_p);
    action = (intptr_t)cb_data;

    assert(first && (first->schema->nodetype == LYS_LIST));
    assert(second && (second->schema == first->schema));

    ctx = first->schema->module->ctx;

    slist = (struct lys_node_list *)first->schema;

    /* compare unique leaves */
    if (action > 0) {
        i = action - 1;
        if (i < slist->unique_size) {
            goto uniquecheck;
        }
    }
    for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
        for (j = 0; j < slist->unique[i].expr_size; j++) {
            /* first */
            diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
            if (diter) {
                val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
            } else {
                /* use default value */
                if (lyd_get_unique_default(slist->unique[i].expr[j], first, &val1)) {
                    return 1;
                }
            }

            /* second */
            diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
            if (diter) {
                val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
            } else {
                /* use default value */
                if (lyd_get_unique_default(slist->unique[i].expr[j], second, &val2)) {
                    return 1;
                }
            }

            if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                /* values differ or either one is not set */
                break;
            }
        }
        if (j && (j == slist->unique[i].expr_size)) {
            /* all unique leafs are the same in this set, create this nice error */
            ly_vlog_build_path(LY_VLOG_LYD, first, &path1, 0, 0);
            ly_vlog_build_path(LY_VLOG_LYD, second, &path2, 0, 0);

            /* use buffer to rebuild the unique string */
            uniq_str = malloc(1024);
            idx_uniq = 0;
            for (j = 0; j < slist->unique[i].expr_size; ++j) {
                if (j) {
                    uniq_str[idx_uniq++] = ' ';
                }
                r = lyd_build_relative_data_path(lys_node_module((struct lys_node *)slist), first,
                                                 slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                if (r == -1) {
                    goto unique_errmsg_cleanup;
                }
                idx_uniq += r;
            }

            LOGVAL(ctx, LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, path1, path2);
unique_errmsg_cleanup:
            free(path1);
            free(path2);
            free(uniq_str);
            return 1;
        }

        if (action > 0) {
            /* done */
            return 0;
        }
    }

    return 0;
}